

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

char * __thiscall
google::protobuf::MessageLite::_InternalParse(MessageLite *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  uint uVar2;
  TcParseTableBase *pTVar3;
  ulong uVar4;
  MessageLite *unaff_R14;
  TcParseTableBase *in_stack_00000010;
  ushort *local_30;
  
  pTVar3 = GetTcParseTable(this);
  local_30 = (ushort *)ptr;
  while( true ) {
    bVar1 = internal::EpsCopyInputStream::DoneWithCheck<false>
                      (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
    if (bVar1) break;
    uVar2 = (uint)pTVar3->fast_idx_mask & (uint)*local_30;
    if ((uVar2 & 7) != 0) {
      internal::protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar4 = (ulong)(uVar2 & 0xfffffff8);
    local_30 = (ushort *)
               (**(code **)(&pTVar3[1].has_bits_offset + uVar4))
                         (this,local_30,ctx,
                          (ulong)*local_30 ^ *(ulong *)(&pTVar3[1].fast_idx_mask + uVar4 * 2),pTVar3
                          ,0);
    if ((local_30 == (ushort *)0x0) || ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0))
    break;
  }
  if ((pTVar3->field_0x9 & 1) == 0) {
    if (local_30 == (ushort *)0x0) {
      internal::TcParser::VerifyHasBitConsistency(unaff_R14,in_stack_00000010);
    }
  }
  else {
    local_30 = (ushort *)(*pTVar3->post_loop_handler)(this,(char *)local_30,ctx);
  }
  return (char *)local_30;
}

Assistant:

const char* MessageLite::_InternalParse(const char* ptr,
                                        internal::ParseContext* ctx) {
  return internal::TcParser::ParseLoop(this, ptr, ctx, GetTcParseTable());
}